

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::readyNow::ReadyNowPromiseNode::~ReadyNowPromiseNode(ReadyNowPromiseNode *this)

{
  ReadyNowPromiseNode *this_local;
  
  ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  return;
}

Assistant:

OwnPromiseNode readyNow() {
  class ReadyNowPromiseNode: public ImmediatePromiseNodeBase {
    // This is like `ConstPromiseNode<Void, Void{}>`, but the compiler won't let me pass a literal
    // value of type `Void` as a template parameter. (Might require C++20?)

  public:
    void destroy() override {}
    void get(ExceptionOrValue& output) noexcept override {
      output.as<Void>() = Void();
    }
  };

  static ReadyNowPromiseNode NODE;
  return OwnPromiseNode(&NODE);
}